

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cvodes_ls.c
# Opt level: O1

int cvLsJacBSWrapper(sunrealtype t,N_Vector yB,N_Vector fyB,SUNMatrix JB,void *cvode_mem,
                    N_Vector tmp1B,N_Vector tmp2B,N_Vector tmp3B)

{
  int iVar1;
  N_Vector *pp_Var2;
  CVodeMem cv_mem;
  CVLsMemB cvlsB_mem;
  CVodeBMem cvB_mem;
  CVadjMem ca_mem;
  
  iVar1 = cvLs_AccessLMemBCur(cvode_mem,"cvLsJacBSWrapper",&cv_mem,&ca_mem,&cvB_mem,&cvlsB_mem);
  if (iVar1 == 0) {
    if (ca_mem->ca_IMinterpSensi == 0) {
      pp_Var2 = (N_Vector *)0x0;
    }
    else {
      pp_Var2 = ca_mem->ca_yStmp;
    }
    iVar1 = (*ca_mem->ca_IMget)(cv_mem,t,ca_mem->ca_ytmp,pp_Var2);
    if (iVar1 == 0) {
      iVar1 = (*cvlsB_mem->jacBS)(t,ca_mem->ca_ytmp,ca_mem->ca_yStmp,yB,fyB,JB,cvB_mem->cv_user_data
                                  ,tmp1B,tmp2B,tmp3B);
    }
    else {
      iVar1 = -1;
      cvProcessError(cv_mem,-1,0x9c1,"cvLsJacBSWrapper",
                     "/workspace/llm4binary/github/license_c_cmakelists/LLNL[P]sundials/src/cvodes/cvodes_ls.c"
                     ,"Bad t for interpolation.");
    }
  }
  return iVar1;
}

Assistant:

static int cvLsJacBSWrapper(sunrealtype t, N_Vector yB, N_Vector fyB,
                            SUNMatrix JB, void* cvode_mem, N_Vector tmp1B,
                            N_Vector tmp2B, N_Vector tmp3B)
{
  CVodeMem cv_mem;
  CVadjMem ca_mem;
  CVodeBMem cvB_mem;
  CVLsMemB cvlsB_mem;
  int retval;

  /* access relevant memory structures */
  retval = cvLs_AccessLMemBCur(cvode_mem, "cvLsJacBSWrapper", &cv_mem, &ca_mem,
                               &cvB_mem, &cvlsB_mem);
  if (retval != CVLS_SUCCESS) { return (retval); }

  /* Forward solution from interpolation */
  if (ca_mem->ca_IMinterpSensi)
  {
    retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, ca_mem->ca_yStmp);
  }
  else { retval = ca_mem->ca_IMget(cv_mem, t, ca_mem->ca_ytmp, NULL); }
  if (retval != CV_SUCCESS)
  {
    cvProcessError(cv_mem, -1, __LINE__, __func__, __FILE__, MSG_LS_BAD_TINTERP);
    return (-1);
  }

  /* Call user's adjoint dense djacBS routine (of type CVLsDenseJacFnBS) */
  return (cvlsB_mem->jacBS(t, ca_mem->ca_ytmp, ca_mem->ca_yStmp, yB, fyB, JB,
                           cvB_mem->cv_user_data, tmp1B, tmp2B, tmp3B));
}